

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ir_hv_accept.cpp
# Opt level: O0

int __thiscall ir_return::accept(ir_return *this,int __fd,sockaddr *__addr,socklen_t *__addr_len)

{
  ir_rvalue *piVar1;
  undefined4 in_register_00000034;
  long *plVar2;
  int local_40;
  int local_3c;
  ir_rvalue *val;
  ir_visitor_status s;
  ir_hierarchical_visitor *v_local;
  ir_return *this_local;
  
  plVar2 = (long *)CONCAT44(in_register_00000034,__fd);
  local_3c = (**(code **)(*plVar2 + 0xe0))();
  if (local_3c == 0) {
    piVar1 = get_value(this);
    if ((piVar1 == (ir_rvalue *)0x0) ||
       (local_40 = (*(piVar1->super_ir_instruction)._vptr_ir_instruction[3])(piVar1,plVar2),
       local_40 == 0)) {
      this_local._4_4_ = (**(code **)(*plVar2 + 0xe8))(plVar2,this);
    }
    else {
      if (local_40 == 1) {
        local_40 = 0;
      }
      this_local._4_4_ = local_40;
    }
  }
  else {
    if (local_3c == 1) {
      local_3c = 0;
    }
    this_local._4_4_ = local_3c;
  }
  return this_local._4_4_;
}

Assistant:

ir_visitor_status
ir_return::accept(ir_hierarchical_visitor *v)
{
   ir_visitor_status s = v->visit_enter(this);
   if (s != visit_continue)
      return (s == visit_continue_with_parent) ? visit_continue : s;

   ir_rvalue *val = this->get_value();
   if (val) {
      s = val->accept(v);
      if (s != visit_continue)
	 return (s == visit_continue_with_parent) ? visit_continue : s;
   }

   return v->visit_leave(this);
}